

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize_external_replayer_linux.hpp
# Opt level: O0

PollResult __thiscall
Fossilize::ExternalReplayer::Impl::poll_progress(Impl *this,Progress *progress)

{
  SharedControlBlock *pSVar1;
  __pid_t _Var2;
  uint32_t uVar3;
  int *piVar4;
  bool bVar5;
  char local_348 [8];
  char buf [64];
  ulong local_300;
  size_t i;
  size_t read_avail;
  int ret;
  bool complete;
  Progress *progress_local;
  Impl *this_local;
  memory_order __b_29;
  memory_order __b_28;
  memory_order __b_27;
  memory_order __b_26;
  memory_order __b_25;
  memory_order __b_24;
  memory_order __b_23;
  memory_order __b_22;
  memory_order __b_21;
  memory_order __b_20;
  memory_order __b_19;
  memory_order __b_18;
  memory_order __b_17;
  memory_order __b_16;
  memory_order __b_15;
  memory_order __b_14;
  memory_order __b_13;
  memory_order __b_12;
  memory_order __b_11;
  memory_order __b_10;
  memory_order __b_9;
  memory_order __b_8;
  memory_order __b_7;
  memory_order __b_6;
  memory_order __b_5;
  memory_order __b_4;
  memory_order __b_3;
  memory_order __b_2;
  memory_order __b_1;
  memory_order __b;
  
  pSVar1 = this->shm_block;
  std::operator&(memory_order_acquire,__memory_order_mask);
  bVar5 = (pSVar1->progress_complete).super___atomic_base<unsigned_int>._M_i != 0;
  if ((-1 < this->pid) || (bVar5)) {
    if ((!bVar5) && (-1 < this->pid)) {
      _Var2 = waitpid(this->pid,&this->wstatus,1);
      if (_Var2 < 1) {
        if (_Var2 < 0) {
          piVar4 = __errno_location();
          this->wstatus = -*piVar4;
          this->synthesized_exit_code = true;
          reset_pid(this);
        }
      }
      else if (((this->wstatus & 0x7fU) == 0) ||
              ('\0' < (char)(((byte)this->wstatus & 0x7f) + 1) >> 1)) {
        reset_pid(this);
      }
    }
    pSVar1 = this->shm_block;
    std::operator&(memory_order_acquire,__memory_order_mask);
    if ((pSVar1->progress_started).super___atomic_base<unsigned_int>._M_i == 0) {
      this_local._0_4_ = ResultNotReady;
    }
    else {
      pSVar1 = this->shm_block;
      std::operator&(memory_order_relaxed,__memory_order_mask);
      (progress->compute).total = (pSVar1->total_compute).super___atomic_base<unsigned_int>._M_i;
      pSVar1 = this->shm_block;
      std::operator&(memory_order_relaxed,__memory_order_mask);
      (progress->compute).parsed = (pSVar1->parsed_compute).super___atomic_base<unsigned_int>._M_i;
      pSVar1 = this->shm_block;
      std::operator&(memory_order_relaxed,__memory_order_mask);
      (progress->compute).parsed_fail =
           (pSVar1->parsed_compute_failures).super___atomic_base<unsigned_int>._M_i;
      pSVar1 = this->shm_block;
      std::operator&(memory_order_relaxed,__memory_order_mask);
      (progress->compute).skipped = (pSVar1->skipped_compute).super___atomic_base<unsigned_int>._M_i
      ;
      pSVar1 = this->shm_block;
      std::operator&(memory_order_relaxed,__memory_order_mask);
      (progress->compute).cached = (pSVar1->cached_compute).super___atomic_base<unsigned_int>._M_i;
      pSVar1 = this->shm_block;
      std::operator&(memory_order_relaxed,__memory_order_mask);
      (progress->compute).completed =
           (pSVar1->successful_compute).super___atomic_base<unsigned_int>._M_i;
      pSVar1 = this->shm_block;
      std::operator&(memory_order_relaxed,__memory_order_mask);
      (progress->graphics).total = (pSVar1->total_graphics).super___atomic_base<unsigned_int>._M_i;
      pSVar1 = this->shm_block;
      std::operator&(memory_order_relaxed,__memory_order_mask);
      (progress->graphics).parsed = (pSVar1->parsed_graphics).super___atomic_base<unsigned_int>._M_i
      ;
      pSVar1 = this->shm_block;
      std::operator&(memory_order_relaxed,__memory_order_mask);
      (progress->graphics).parsed_fail =
           (pSVar1->parsed_graphics_failures).super___atomic_base<unsigned_int>._M_i;
      pSVar1 = this->shm_block;
      std::operator&(memory_order_relaxed,__memory_order_mask);
      (progress->graphics).skipped =
           (pSVar1->skipped_graphics).super___atomic_base<unsigned_int>._M_i;
      pSVar1 = this->shm_block;
      std::operator&(memory_order_relaxed,__memory_order_mask);
      (progress->graphics).cached = (pSVar1->cached_graphics).super___atomic_base<unsigned_int>._M_i
      ;
      pSVar1 = this->shm_block;
      std::operator&(memory_order_relaxed,__memory_order_mask);
      (progress->graphics).completed =
           (pSVar1->successful_graphics).super___atomic_base<unsigned_int>._M_i;
      pSVar1 = this->shm_block;
      std::operator&(memory_order_relaxed,__memory_order_mask);
      (progress->raytracing).total =
           (pSVar1->total_raytracing).super___atomic_base<unsigned_int>._M_i;
      pSVar1 = this->shm_block;
      std::operator&(memory_order_relaxed,__memory_order_mask);
      (progress->raytracing).parsed =
           (pSVar1->parsed_raytracing).super___atomic_base<unsigned_int>._M_i;
      pSVar1 = this->shm_block;
      std::operator&(memory_order_relaxed,__memory_order_mask);
      (progress->raytracing).parsed_fail =
           (pSVar1->parsed_raytracing).super___atomic_base<unsigned_int>._M_i;
      pSVar1 = this->shm_block;
      std::operator&(memory_order_relaxed,__memory_order_mask);
      (progress->raytracing).skipped =
           (pSVar1->skipped_raytracing).super___atomic_base<unsigned_int>._M_i;
      pSVar1 = this->shm_block;
      std::operator&(memory_order_relaxed,__memory_order_mask);
      (progress->raytracing).cached =
           (pSVar1->cached_raytracing).super___atomic_base<unsigned_int>._M_i;
      pSVar1 = this->shm_block;
      std::operator&(memory_order_relaxed,__memory_order_mask);
      (progress->raytracing).completed =
           (pSVar1->successful_raytracing).super___atomic_base<unsigned_int>._M_i;
      pSVar1 = this->shm_block;
      std::operator&(memory_order_relaxed,__memory_order_mask);
      progress->completed_modules =
           (pSVar1->successful_modules).super___atomic_base<unsigned_int>._M_i;
      pSVar1 = this->shm_block;
      std::operator&(memory_order_relaxed,__memory_order_mask);
      progress->missing_modules =
           (pSVar1->parsed_module_failures).super___atomic_base<unsigned_int>._M_i;
      pSVar1 = this->shm_block;
      std::operator&(memory_order_relaxed,__memory_order_mask);
      progress->total_modules = (pSVar1->total_modules).super___atomic_base<unsigned_int>._M_i;
      pSVar1 = this->shm_block;
      std::operator&(memory_order_relaxed,__memory_order_mask);
      progress->banned_modules = (pSVar1->banned_modules).super___atomic_base<unsigned_int>._M_i;
      pSVar1 = this->shm_block;
      std::operator&(memory_order_relaxed,__memory_order_mask);
      progress->module_validation_failures =
           (pSVar1->module_validation_failures).super___atomic_base<unsigned_int>._M_i;
      pSVar1 = this->shm_block;
      std::operator&(memory_order_relaxed,__memory_order_mask);
      progress->clean_crashes =
           (pSVar1->clean_process_deaths).super___atomic_base<unsigned_int>._M_i;
      pSVar1 = this->shm_block;
      std::operator&(memory_order_relaxed,__memory_order_mask);
      progress->dirty_crashes =
           (pSVar1->dirty_process_deaths).super___atomic_base<unsigned_int>._M_i;
      pSVar1 = this->shm_block;
      std::operator&(memory_order_relaxed,__memory_order_mask);
      progress->total_graphics_pipeline_blobs =
           (pSVar1->static_total_count_graphics).super___atomic_base<unsigned_int>._M_i;
      pSVar1 = this->shm_block;
      std::operator&(memory_order_relaxed,__memory_order_mask);
      progress->total_compute_pipeline_blobs =
           (pSVar1->static_total_count_compute).super___atomic_base<unsigned_int>._M_i;
      pSVar1 = this->shm_block;
      std::operator&(memory_order_relaxed,__memory_order_mask);
      progress->total_raytracing_pipeline_blobs =
           (pSVar1->static_total_count_raytracing).super___atomic_base<unsigned_int>._M_i;
      futex_wrapper_lock(&this->shm_block->futex_lock);
      uVar3 = shared_control_block_read_avail(this->shm_block);
      for (local_300 = 0x40; local_300 <= uVar3; local_300 = local_300 + 0x40) {
        memset(local_348,0,0x40);
        shared_control_block_read(this->shm_block,local_348,0x40);
        parse_message(this,local_348);
      }
      futex_wrapper_unlock(&this->shm_block->futex_lock);
      this_local._0_4_ = (PollResult)bVar5;
    }
  }
  else {
    this_local._0_4_ = Error;
  }
  return (PollResult)this_local;
}

Assistant:

ExternalReplayer::PollResult ExternalReplayer::Impl::poll_progress(ExternalReplayer::Progress &progress)
{
	bool complete = shm_block->progress_complete.load(std::memory_order_acquire) != 0;

	if (pid < 0 && !complete)
		return ExternalReplayer::PollResult::Error;

	// Try to avoid a situation where we're endlessly polling, in case the application died too early during startup and we failed
	// to catch it ending by receiving a completed wait through is_process_complete().
	if (!complete && pid >= 0)
	{
		int ret;
		// This serves as a check to see if process is still alive.
		if ((ret = waitpid(pid, &wstatus, WNOHANG)) > 0)
		{
			// Child process can receive SIGCONT/SIGSTOP which is benign.
			// This should normally only happen when the process is being debugged.
			if (WIFEXITED(wstatus) || WIFSIGNALED(wstatus))
				reset_pid();
		}
		else if (ret < 0)
		{
			// The child does not exist anymore, and we were unable to reap it.
			// This can happen if the process installed a SIGCHLD handler behind our back.
			wstatus = -errno;
			synthesized_exit_code = true;
			reset_pid();
		}

		// If ret is 0, that means the process is still alive and nothing happened to it yet.
	}

	if (shm_block->progress_started.load(std::memory_order_acquire) == 0)
		return ExternalReplayer::PollResult::ResultNotReady;

	progress.compute.total = shm_block->total_compute.load(std::memory_order_relaxed);
	progress.compute.parsed = shm_block->parsed_compute.load(std::memory_order_relaxed);
	progress.compute.parsed_fail = shm_block->parsed_compute_failures.load(std::memory_order_relaxed);
	progress.compute.skipped = shm_block->skipped_compute.load(std::memory_order_relaxed);
	progress.compute.cached = shm_block->cached_compute.load(std::memory_order_relaxed);
	progress.compute.completed = shm_block->successful_compute.load(std::memory_order_relaxed);

	progress.graphics.total = shm_block->total_graphics.load(std::memory_order_relaxed);
	progress.graphics.parsed = shm_block->parsed_graphics.load(std::memory_order_relaxed);
	progress.graphics.parsed_fail = shm_block->parsed_graphics_failures.load(std::memory_order_relaxed);
	progress.graphics.skipped = shm_block->skipped_graphics.load(std::memory_order_relaxed);
	progress.graphics.cached = shm_block->cached_graphics.load(std::memory_order_relaxed);
	progress.graphics.completed = shm_block->successful_graphics.load(std::memory_order_relaxed);

	progress.raytracing.total = shm_block->total_raytracing.load(std::memory_order_relaxed);
	progress.raytracing.parsed = shm_block->parsed_raytracing.load(std::memory_order_relaxed);
	progress.raytracing.parsed_fail = shm_block->parsed_raytracing.load(std::memory_order_relaxed);
	progress.raytracing.skipped = shm_block->skipped_raytracing.load(std::memory_order_relaxed);
	progress.raytracing.cached = shm_block->cached_raytracing.load(std::memory_order_relaxed);
	progress.raytracing.completed = shm_block->successful_raytracing.load(std::memory_order_relaxed);

	progress.completed_modules = shm_block->successful_modules.load(std::memory_order_relaxed);
	progress.missing_modules = shm_block->parsed_module_failures.load(std::memory_order_relaxed);
	progress.total_modules = shm_block->total_modules.load(std::memory_order_relaxed);
	progress.banned_modules = shm_block->banned_modules.load(std::memory_order_relaxed);
	progress.module_validation_failures = shm_block->module_validation_failures.load(std::memory_order_relaxed);
	progress.clean_crashes = shm_block->clean_process_deaths.load(std::memory_order_relaxed);
	progress.dirty_crashes = shm_block->dirty_process_deaths.load(std::memory_order_relaxed);

	progress.total_graphics_pipeline_blobs = shm_block->static_total_count_graphics.load(std::memory_order_relaxed);
	progress.total_compute_pipeline_blobs = shm_block->static_total_count_compute.load(std::memory_order_relaxed);
	progress.total_raytracing_pipeline_blobs = shm_block->static_total_count_raytracing.load(std::memory_order_relaxed);

	futex_wrapper_lock(&shm_block->futex_lock);
	size_t read_avail = shared_control_block_read_avail(shm_block);
	for (size_t i = ControlBlockMessageSize; i <= read_avail; i += ControlBlockMessageSize)
	{
		char buf[ControlBlockMessageSize] = {};
		shared_control_block_read(shm_block, buf, sizeof(buf));
		parse_message(buf);
	}
	futex_wrapper_unlock(&shm_block->futex_lock);
	return complete ? ExternalReplayer::PollResult::Complete : ExternalReplayer::PollResult::Running;
}